

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chaiscript::AST_Node>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chaiscript::AST_Node>_>
           *this)

{
  void *in_RDI;
  
  ~Proxy_Function_Callable_Impl
            ((Proxy_Function_Callable_Impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chaiscript::AST_Node>_>
              *)0x3cfd58);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}